

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset_test.c
# Opt level: O2

void process_reset_test(int converter)

{
  float fVar1;
  char *pcVar2;
  SRC_STATE *state;
  char *__format;
  long lVar3;
  float *pfVar4;
  undefined8 uStack_80;
  int error;
  SRC_DATA src_data;
  
  pcVar2 = src_get_name(converter);
  printf("\tprocess_reset_test  (%-28s) ....... ",pcVar2);
  fflush(_stdout);
  for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)data_one + lVar3) = 0x3f800000;
    *(undefined4 *)((long)data_zero + lVar3) = 0;
  }
  state = src_new(converter,1,&error);
  if (state == (SRC_STATE *)0x0) {
    pcVar2 = src_strerror(error);
    __format = "\n\nLine %d : src_new() failed : %s.\n\n";
    uStack_80 = 0x45;
  }
  else {
    src_data.data_in = data_one;
    pfVar4 = process_reset_test::output;
    src_data.data_out = process_reset_test::output;
    src_data.input_frames = 0x800;
    src_data.output_frames = 0x800;
    src_data.src_ratio = 0.9;
    src_data.end_of_input = 1;
    error = src_process(state,&src_data);
    if (error == 0) {
      src_reset(state);
      src_data.data_in = data_zero;
      src_data.data_out = process_reset_test::output;
      src_data.input_frames = 0x800;
      src_data.output_frames = 0x800;
      src_data.src_ratio = 0.9;
      src_data.end_of_input = 1;
      error = src_process(state,&src_data);
      if (error == 0) {
        lVar3 = 0;
        while( true ) {
          if (lVar3 == 0x400) {
            src_set_ratio(state,1.0);
            src_delete(state);
            puts("ok");
            return;
          }
          fVar1 = *pfVar4;
          if ((fVar1 != 0.0) || (NAN(fVar1))) break;
          lVar3 = lVar3 + 1;
          pfVar4 = pfVar4 + 1;
        }
        printf("\n\nLine %d : output [%d] should be 0.0, is %f.\n",(double)fVar1,0x69);
        goto LAB_00101455;
      }
      pcVar2 = src_strerror(error);
      __format = "\n\nLine %d : src_simple () returned error : %s\n\n";
      uStack_80 = 0x62;
    }
    else {
      pcVar2 = src_strerror(error);
      __format = "\n\nLine %d : src_simple () returned error : %s\n\n";
      uStack_80 = 0x52;
    }
  }
  printf(__format,uStack_80,pcVar2);
LAB_00101455:
  exit(1);
}

Assistant:

static void
process_reset_test (int converter)
{	static float output [BUFFER_LEN] ;

	SRC_STATE *src_state ;
	SRC_DATA src_data ;
	int k, error ;

	printf ("\tprocess_reset_test  (%-28s) ....... ", src_get_name (converter)) ;
	fflush (stdout) ;

	for (k = 0 ; k < BUFFER_LEN ; k++)
	{	data_one [k] = 1.0 ;
		data_zero [k] = 0.0 ;
		} ;

	/* Get a converter. */
	if ((src_state = src_new (converter, 1, &error)) == NULL)
	{	printf ("\n\nLine %d : src_new() failed : %s.\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Process a bunch of 1.0 valued samples. */
	src_data.data_in		= data_one ;
	src_data.data_out		= output ;
	src_data.input_frames	= BUFFER_LEN ;
	src_data.output_frames	= BUFFER_LEN ;
	src_data.src_ratio		= 0.9 ;
	src_data.end_of_input	= 1 ;

	if ((error = src_process (src_state, &src_data)) != 0)
	{	printf ("\n\nLine %d : src_simple () returned error : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Reset the state of the converter.*/
	src_reset (src_state) ;

	/* Now process some zero data. */
	src_data.data_in		= data_zero ;
	src_data.data_out		= output ;
	src_data.input_frames	= BUFFER_LEN ;
	src_data.output_frames	= BUFFER_LEN ;
	src_data.src_ratio		= 0.9 ;
	src_data.end_of_input	= 1 ;

	if ((error = src_process (src_state, &src_data)) != 0)
	{	printf ("\n\nLine %d : src_simple () returned error : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	/* Finally make sure that the output data is zero ie reset was successful. */
	for (k = 0 ; k < BUFFER_LEN / 2 ; k++)
		if (output [k] != 0.0)
		{	printf ("\n\nLine %d : output [%d] should be 0.0, is %f.\n", __LINE__, k, output [k]) ;
			exit (1) ;
			} ;

	/* Make sure that this function has been exported. */
	src_set_ratio (src_state, 1.0) ;

	/* Delete converter. */
	src_state = src_delete (src_state) ;

	puts ("ok") ;
}